

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O1

bool duckdb::TemplatedLikeOperator<(char)37,(char)95,true,duckdb::StandardCharacterReader>
               (char *sdata,idx_t slen,char *pdata,idx_t plen,char escape)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  SyntaxException *this;
  ulong uVar6;
  ulong uVar7;
  idx_t slen_00;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  string local_50;
  
  bVar10 = plen == 0;
  if (slen == 0 || bVar10) {
    uVar9 = 0;
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    uVar8 = 0;
    do {
      cVar2 = pdata[uVar6];
      uVar9 = uVar8;
      if (cVar2 == escape) {
        uVar6 = uVar6 + 1;
        if (uVar6 == plen) {
          this = (SyntaxException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Like pattern must not end with escape character!","");
          SyntaxException::SyntaxException(this,&local_50);
          __cxa_throw(this,&SyntaxException::typeinfo,::std::runtime_error::~runtime_error);
        }
        cVar2 = pdata[uVar6];
joined_r0x014f2199:
        if (cVar2 == sdata[uVar8]) {
          bVar3 = true;
          uVar9 = uVar8 + 1;
        }
        else {
LAB_014f219d:
          bVar10 = false;
          bVar3 = false;
        }
      }
      else if (cVar2 == '_') {
        uVar9 = uVar8 + 1;
        if (uVar8 + 1 < slen) {
          uVar9 = slen;
        }
        bVar3 = true;
        if (uVar8 + 1 < slen) {
          uVar9 = uVar8 + 1;
        }
      }
      else {
        if (cVar2 != '%') goto joined_r0x014f2199;
        uVar5 = uVar6 + 1;
        uVar7 = uVar6;
        if (uVar6 + 1 < plen) {
          uVar5 = plen;
        }
        do {
          uVar1 = uVar7 + 1;
          uVar6 = uVar5;
          if (plen <= uVar1) break;
          lVar4 = uVar7 + 1;
          uVar7 = uVar1;
          uVar6 = uVar1;
        } while (pdata[lVar4] == '%');
        if (plen - uVar6 == 0) {
          bVar10 = true;
          bVar3 = false;
        }
        else {
          slen_00 = slen - uVar8;
          if (slen < uVar8 || slen_00 == 0) goto LAB_014f219d;
          do {
            bVar10 = TemplatedLikeOperator<(char)37,(char)95,true,duckdb::StandardCharacterReader>
                               (sdata + uVar8,slen_00,pdata + uVar6,plen - uVar6,escape);
            if (bVar10) {
              bVar3 = false;
              uVar9 = uVar8;
              break;
            }
            uVar8 = uVar8 + 1;
            bVar3 = false;
            slen_00 = slen_00 - 1;
            uVar9 = slen;
          } while (slen_00 != 0);
        }
      }
      if (!bVar3) {
        return bVar10;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar6 < plen) && (uVar8 = uVar9, uVar9 < slen));
  }
  uVar8 = uVar6;
  if (uVar6 < plen) {
    do {
      uVar8 = uVar6;
      if (pdata[uVar6] != '%') break;
      uVar6 = uVar6 + 1;
      uVar8 = plen;
    } while (plen != uVar6);
  }
  return uVar9 == slen && uVar8 == plen;
}

Assistant:

bool TemplatedLikeOperator(const char *sdata, idx_t slen, const char *pdata, idx_t plen, char escape) {
	idx_t pidx = 0;
	idx_t sidx = 0;
	for (; pidx < plen && sidx < slen; pidx++) {
		char pchar = READER::Operation(pdata, pidx);
		char schar = READER::Operation(sdata, sidx);
		if (HAS_ESCAPE && pchar == escape) {
			pidx++;
			if (pidx == plen) {
				throw SyntaxException("Like pattern must not end with escape character!");
			}
			if (pdata[pidx] != schar) {
				return false;
			}
			sidx++;
		} else if (pchar == UNDERSCORE) {
			READER::NextCharacter(sdata, slen, sidx);
		} else if (pchar == PERCENTAGE) {
			pidx++;
			while (pidx < plen && pdata[pidx] == PERCENTAGE) {
				pidx++;
			}
			if (pidx == plen) {
				return true; /* tail is acceptable */
			}
			for (; sidx < slen; sidx++) {
				if (TemplatedLikeOperator<PERCENTAGE, UNDERSCORE, HAS_ESCAPE, READER>(
				        sdata + sidx, slen - sidx, pdata + pidx, plen - pidx, escape)) {
					return true;
				}
			}
			return false;
		} else if (pchar == schar) {
			sidx++;
		} else {
			return false;
		}
	}
	while (pidx < plen && pdata[pidx] == PERCENTAGE) {
		pidx++;
	}
	return pidx == plen && sidx == slen;
}